

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::PropagateAssetResolverState
               (uint32_t depth,PrimSpec *ps,string *cwp,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *search_paths)

{
  pointer pPVar1;
  bool bVar2;
  PrimSpec *child;
  pointer ps_00;
  
  if (0x20000000 < depth) {
    return false;
  }
  ::std::__cxx11::string::_M_assign((string *)&ps->_current_working_path);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ps->_asset_search_paths,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)search_paths);
  ps_00 = (ps->_children).
          super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pPVar1 = (ps->_children).
           super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ps_00 == pPVar1) {
    bVar2 = true;
  }
  else {
    do {
      bVar2 = PropagateAssetResolverState(depth + 1,ps_00,cwp,search_paths);
      if (!bVar2) {
        return bVar2;
      }
      ps_00 = ps_00 + 1;
    } while (ps_00 != pPVar1);
  }
  return bVar2;
}

Assistant:

static bool PropagateAssetResolverState(uint32_t depth, PrimSpec &ps,
                                 const std::string &cwp,
                                 const std::vector<std::string> &search_paths) {
  if (depth > (1024 * 1024 * 512)) {
    return false;
  }

  if (depth == 0) {
    DCOUT("current_working_path: " << cwp);
    DCOUT("search_paths: " << search_paths);
  }

  ps.set_asset_resolution_state(cwp, search_paths);

  for (auto &child : ps.children()) {
    if (!PropagateAssetResolverState(depth + 1, child, cwp, search_paths)) {
      return false;
    }
  }

    return true;
}